

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprAssignVarNumber(Parse *pParse,Expr *pExpr,u32 n)

{
  int iVar1;
  char *pcVar2;
  VList *pVVar3;
  bool bVar4;
  long lStack_40;
  int bOk;
  i64 i;
  int doAdd;
  ynVar x;
  char *z;
  sqlite3 *db;
  Expr *pEStack_18;
  u32 n_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  z = (char *)pParse->db;
  if (pExpr != (Expr *)0x0) {
    _doAdd = (pExpr->u).zToken;
    db._4_4_ = n;
    pEStack_18 = pExpr;
    pExpr_local = (Expr *)pParse;
    if (_doAdd[1] == '\0') {
      i._6_2_ = pParse->nVar + 1;
      pParse->nVar = i._6_2_;
    }
    else {
      i._0_4_ = 0;
      if (*_doAdd == '?') {
        if (n == 2) {
          lStack_40 = (long)(_doAdd[1] + -0x30);
          bVar4 = true;
        }
        else {
          iVar1 = sqlite3Atoi64(_doAdd + 1,&stack0xffffffffffffffc0,n - 1,'\x01');
          bVar4 = iVar1 == 0;
        }
        if (((!bVar4) || (lStack_40 < 1)) || (*(int *)(z + 0xa0) < lStack_40)) {
          sqlite3ErrorMsg((Parse *)pExpr_local,"variable number must be between ?1 and ?%d",
                          (ulong)*(uint *)(z + 0xa0));
          return;
        }
        i._6_2_ = (short)lStack_40;
        if (*(short *)&pExpr_local[3].pRight < i._6_2_) {
          *(short *)&pExpr_local[3].pRight = i._6_2_;
          i._0_4_ = 1;
        }
        else {
          pcVar2 = sqlite3VListNumToName(*(VList **)&pExpr_local[3].iColumn,(int)i._6_2_);
          if (pcVar2 == (char *)0x0) {
            i._0_4_ = 1;
          }
        }
      }
      else {
        iVar1 = sqlite3VListNameToNum(pParse->pVList,_doAdd,n);
        i._6_2_ = (short)iVar1;
        if (i._6_2_ == 0) {
          i._6_2_ = *(short *)&pExpr_local[3].pRight + 1;
          *(short *)&pExpr_local[3].pRight = i._6_2_;
          i._0_4_ = 1;
        }
      }
      if ((int)i != 0) {
        pVVar3 = sqlite3VListAdd((sqlite3 *)z,*(VList **)&pExpr_local[3].iColumn,_doAdd,db._4_4_,
                                 (int)i._6_2_);
        *(VList **)&pExpr_local[3].iColumn = pVVar3;
      }
    }
    pEStack_18->iColumn = i._6_2_;
    if (*(int *)(z + 0xa0) < (int)i._6_2_) {
      sqlite3ErrorMsg((Parse *)pExpr_local,"too many SQL variables");
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAssignVarNumber(Parse *pParse, Expr *pExpr, u32 n){
  sqlite3 *db = pParse->db;
  const char *z;
  ynVar x;

  if( pExpr==0 ) return;
  assert( !ExprHasProperty(pExpr, EP_IntValue|EP_Reduced|EP_TokenOnly) );
  z = pExpr->u.zToken;
  assert( z!=0 );
  assert( z[0]!=0 );
  assert( n==(u32)sqlite3Strlen30(z) );
  if( z[1]==0 ){
    /* Wildcard of the form "?".  Assign the next variable number */
    assert( z[0]=='?' );
    x = (ynVar)(++pParse->nVar);
  }else{
    int doAdd = 0;
    if( z[0]=='?' ){
      /* Wildcard of the form "?nnn".  Convert "nnn" to an integer and
      ** use it as the variable number */
      i64 i;
      int bOk;
      if( n==2 ){ /*OPTIMIZATION-IF-TRUE*/
        i = z[1]-'0';  /* The common case of ?N for a single digit N */
        bOk = 1;
      }else{
        bOk = 0==sqlite3Atoi64(&z[1], &i, n-1, SQLITE_UTF8);
      }
      testcase( i==0 );
      testcase( i==1 );
      testcase( i==db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER]-1 );
      testcase( i==db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] );
      if( bOk==0 || i<1 || i>db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] ){
        sqlite3ErrorMsg(pParse, "variable number must be between ?1 and ?%d",
            db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER]);
        return;
      }
      x = (ynVar)i;
      if( x>pParse->nVar ){
        pParse->nVar = (int)x;
        doAdd = 1;
      }else if( sqlite3VListNumToName(pParse->pVList, x)==0 ){
        doAdd = 1;
      }
    }else{
      /* Wildcards like ":aaa", "$aaa" or "@aaa".  Reuse the same variable
      ** number as the prior appearance of the same name, or if the name
      ** has never appeared before, reuse the same variable number
      */
      x = (ynVar)sqlite3VListNameToNum(pParse->pVList, z, n);
      if( x==0 ){
        x = (ynVar)(++pParse->nVar);
        doAdd = 1;
      }
    }
    if( doAdd ){
      pParse->pVList = sqlite3VListAdd(db, pParse->pVList, z, n, x);
    }
  }
  pExpr->iColumn = x;
  if( x>db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] ){
    sqlite3ErrorMsg(pParse, "too many SQL variables");
  }
}